

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_compile_file(unqlite *pDb,char *zPath,unqlite_vm **ppOut)

{
  int local_34;
  jx9_vm *pjStack_30;
  int rc;
  jx9_vm *pVm;
  unqlite_vm **ppOut_local;
  char *zPath_local;
  unqlite *pDb_local;
  
  if (((pDb == (unqlite *)0x0) || (pDb->nMagic != 0xdb7c2712)) || (ppOut == (unqlite_vm **)0x0)) {
    pDb_local._4_4_ = -0x18;
  }
  else {
    pVm = (jx9_vm *)ppOut;
    ppOut_local = (unqlite_vm **)zPath;
    zPath_local = (char *)pDb;
    local_34 = jx9_compile_file((pDb->sDB).pJx9,zPath,&stack0xffffffffffffffd0);
    if ((local_34 == 0) &&
       (local_34 = unqliteInitVm((unqlite *)zPath_local,pjStack_30,(unqlite_vm **)pVm),
       local_34 != 0)) {
      jx9_vm_release(pjStack_30);
    }
    pDb_local._4_4_ = local_34;
  }
  return pDb_local._4_4_;
}

Assistant:

int unqlite_compile_file(unqlite *pDb,const char *zPath,unqlite_vm **ppOut)
{
	jx9_vm *pVm;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) || ppOut == 0){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT;
	 }
#endif
	 /* Compile the Jx9 script first */
	rc = jx9_compile_file(pDb->sDB.pJx9,zPath,&pVm);
	if( rc == JX9_OK ){
		/* Allocate a new unqlite VM instance */
		rc = unqliteInitVm(pDb,pVm,ppOut);
		if( rc != UNQLITE_OK ){
			/* Release the Jx9 VM */
			jx9_vm_release(pVm);
		}
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}